

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

Expression * __thiscall
wasm::TranslateToFuzzReader::makeArrayGet(TranslateToFuzzReader *this,Type type)

{
  key_type kVar1;
  bool bVar2;
  uint32_t uVar3;
  mapped_type *vec;
  value_type *pvVar4;
  Expression *pEVar5;
  Expression *pEVar6;
  undefined1 *puVar7;
  Expression *pEVar8;
  value_type arrayType;
  BoundsCheck check;
  key_type local_38;
  Type type_local;
  
  local_38.id = type.id;
  vec = std::__detail::
        _Map_base<wasm::Type,_std::pair<const_wasm::Type,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
        ::operator[]((_Map_base<wasm::Type,_std::pair<const_wasm::Type,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      *)&this->typeArrays,&local_38);
  if ((vec->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
      super__Vector_impl_data._M_start ==
      (vec->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    __assert_fail("!arrays.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0x13aa,"Expression *wasm::TranslateToFuzzReader::makeArrayGet(Type)");
  }
  pvVar4 = Random::pick<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
                     (&this->random,vec);
  pEVar5 = makeTrappingRefUse(this,(HeapType)pvVar4->id);
  pEVar6 = make(this,(Type)0x2);
  wasm::HeapType::getArray();
  bVar2 = maybeSignedGet(this,(Field *)&arrayType);
  if ((this->allowOOB == true) &&
     (uVar3 = Random::upTo(&this->random,10), kVar1.id = local_38.id, uVar3 == 0)) {
    pEVar8 = (Expression *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x28,8);
    pEVar8->_id = ArrayGetId;
    *(Expression **)(pEVar8 + 1) = pEVar5;
    pEVar8[1].type.id = (uintptr_t)pEVar6;
    (pEVar8->type).id = kVar1.id;
    pEVar8[2]._id = bVar2;
    wasm::ArrayGet::finalize();
    return pEVar8;
  }
  makeArrayBoundsCheck
            ((BoundsCheck *)&arrayType,pEVar5,pEVar6,this->funcContext->func,&this->builder,
             (Expression *)0x0);
  kVar1.id = local_38.id;
  puVar7 = (undefined1 *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x28,8);
  *puVar7 = 0x4a;
  *(undefined8 *)(puVar7 + 8) = 0;
  puVar7[0x20] = 0;
  *(Expression **)(puVar7 + 0x10) = check.condition;
  *(Expression **)(puVar7 + 0x18) = check.getRef;
  *(uintptr_t *)(puVar7 + 8) = kVar1.id;
  puVar7[0x20] = bVar2;
  wasm::ArrayGet::finalize();
  pEVar5 = makeTrivial(this,(Type)local_38.id);
  pEVar6 = (Expression *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x28,8);
  pEVar6->_id = IfId;
  (pEVar6->type).id = 0;
  *(uintptr_t *)(pEVar6 + 1) = arrayType.id;
  pEVar6[1].type.id = (uintptr_t)puVar7;
  *(Expression **)(pEVar6 + 2) = pEVar5;
  wasm::If::finalize(pEVar6);
  return pEVar6;
}

Assistant:

Expression* TranslateToFuzzReader::makeArrayGet(Type type) {
  auto& arrays = typeArrays[type];
  assert(!arrays.empty());
  auto arrayType = pick(arrays);
  auto* ref = makeTrappingRefUse(arrayType);
  auto* index = make(Type::i32);
  auto signed_ = maybeSignedGet(arrayType.getArray().element);
  // Only rarely emit a plain get which might trap. See related logic in
  // ::makePointer().
  if (allowOOB && oneIn(10)) {
    return builder.makeArrayGet(ref, index, type, signed_);
  }
  // To avoid a trap, check the length dynamically using this pattern:
  //
  //   index < array.len ? array[index] : ..some fallback value..
  //
  auto check = makeArrayBoundsCheck(ref, index, funcContext->func, builder);
  auto* get = builder.makeArrayGet(check.getRef, check.getIndex, type, signed_);
  auto* fallback = makeTrivial(type);
  return builder.makeIf(check.condition, get, fallback);
}